

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_reader.hpp
# Opt level: O2

unsigned_long __thiscall
duckdb::ByteReader::ReadValue<unsigned_long>(ByteReader *this,uint8_t bytes,uint8_t trailing_zero)

{
  uint uVar1;
  uint8_t *puVar2;
  unsigned_long uVar3;
  uint32_t uVar4;
  undefined7 in_register_00000031;
  
  switch((int)CONCAT71(in_register_00000031,bytes)) {
  case 1:
    uVar3 = (unsigned_long)this->buffer[this->index];
    uVar4 = this->index + 1;
    break;
  case 2:
    uVar3 = (unsigned_long)*(ushort *)(this->buffer + this->index);
    uVar4 = this->index + 2;
    break;
  case 3:
    uVar1 = this->index;
    uVar3 = (unsigned_long)
            CONCAT12(this->buffer[(ulong)uVar1 + 2],*(undefined2 *)(this->buffer + uVar1));
    uVar4 = uVar1 + 3;
    break;
  case 4:
    uVar3 = (unsigned_long)*(uint *)(this->buffer + this->index);
    uVar4 = this->index + 4;
    break;
  case 5:
    uVar1 = this->index;
    uVar3 = (unsigned_long)
            CONCAT14(this->buffer[(ulong)uVar1 + 4],*(undefined4 *)(this->buffer + uVar1));
    uVar4 = uVar1 + 5;
    break;
  case 6:
    uVar1 = this->index;
    uVar3 = (unsigned_long)
            CONCAT24(*(undefined2 *)(this->buffer + (ulong)uVar1 + 4),
                     *(undefined4 *)(this->buffer + uVar1));
    uVar4 = uVar1 + 6;
    break;
  case 7:
    puVar2 = this->buffer;
    uVar1 = this->index;
    uVar3 = (unsigned_long)
            CONCAT34(CONCAT12(puVar2[(ulong)uVar1 + 6],*(undefined2 *)(puVar2 + (ulong)uVar1 + 4)),
                     *(undefined4 *)(puVar2 + uVar1));
    uVar4 = uVar1 + 7;
    break;
  default:
    if (7 < trailing_zero) {
      return 0;
    }
    uVar3 = *(unsigned_long *)(this->buffer + this->index);
    uVar4 = this->index + 8;
  }
  this->index = uVar4;
  return uVar3;
}

Assistant:

inline T ReadValue(uint8_t bytes, uint8_t trailing_zero) {
		T result = 0;
		switch (bytes) {
			// LCOV_EXCL_START
		case 1:
			result = Load<uint8_t>(buffer + index);
			index++;
			return result;
		case 2:
			result = Load<uint16_t>(buffer + index);
			index += 2;
			return result;
		case 3:
			memcpy(&result, (void *)(buffer + index), 3);
			index += 3;
			return result;
		case 4:
			result = Load<uint32_t>(buffer + index);
			index += 4;
			return result;
		case 5:
			memcpy(&result, (void *)(buffer + index), 5);
			index += 5;
			return result;
		case 6:
			memcpy(&result, (void *)(buffer + index), 6);
			index += 6;
			return result;
		case 7:
			memcpy(&result, (void *)(buffer + index), 7);
			index += 7;
			return result;
			// LCOV_EXCL_STOP
		default:
			if (trailing_zero < 8) {
				result = Load<T>(buffer + index);
				index += sizeof(T);
				return result;
			}
			return result;
		}
	}